

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_posix::std_converter<wchar_t>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,std_converter<wchar_t> *this,conversion_type how,
          char_type_conflict *begin,char_type_conflict *end,int param_4)

{
  string_type *res;
  
  if (how - lower_case < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
    for (; begin != end; begin = (char_type_conflict *)((wint_t *)begin + 1)) {
      towlower_l(*begin,(__locale_t)
                        *(this->lc_).
                         super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    }
  }
  else if (how == upper_case) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
    for (; begin != end; begin = (char_type_conflict *)((wint_t *)begin + 1)) {
      towupper_l(*begin,(__locale_t)
                        *(this->lc_).
                         super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)__return_storage_ptr__,begin,end)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case converter_base::upper_case:
            {
                string_type res;
                res.reserve(end-begin);
                while(begin!=end) {
                    res+=case_traits<char_type>::upper(*begin++,*lc_);
                }
                return res;
            }
        case converter_base::lower_case:
        case converter_base::case_folding:
            {
                string_type res;
                res.reserve(end-begin);
                while(begin!=end) {
                    res+=case_traits<char_type>::lower(*begin++,*lc_);
                }
                return res;
            }
        default:
            return string_type(begin,end-begin);
        }
    }